

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakePolicyCommand::InitialPass
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  string local_270;
  ostringstream local_250 [8];
  ostringstream e;
  allocator local_d1;
  string local_d0;
  PolicyMap local_b0;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakePolicyCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"requires at least one argument.",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    bVar1 = std::operator==(pvVar3,"SET");
    if (bVar1) {
      this_local._7_1_ =
           HandleSetMode(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      bVar1 = std::operator==(pvVar3,"GET");
      if (bVar1) {
        this_local._7_1_ =
             HandleGetMode(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local);
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,0);
        bVar1 = std::operator==(pvVar3,"PUSH");
        if (bVar1) {
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
          if (sVar2 < 2) {
            this_00 = (this->super_cmCommand).Makefile;
            memset(&local_b0,0,0x28);
            cmPolicies::PolicyMap::PolicyMap(&local_b0);
            cmMakefile::PushPolicy(this_00,false,&local_b0);
            this_local._7_1_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_80,"PUSH may not be given additional arguments.",&local_81);
            cmCommand::SetError(&this->super_cmCommand,&local_80);
            std::__cxx11::string::~string((string *)&local_80);
            std::allocator<char>::~allocator((allocator<char> *)&local_81);
            this_local._7_1_ = 0;
          }
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,0);
          bVar1 = std::operator==(pvVar3,"POP");
          if (bVar1) {
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local);
            if (sVar2 < 2) {
              cmMakefile::PopPolicy((this->super_cmCommand).Makefile);
              this_local._7_1_ = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_d0,"POP may not be given additional arguments.",&local_d1)
              ;
              cmCommand::SetError(&this->super_cmCommand,&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::allocator<char>::~allocator((allocator<char> *)&local_d1);
              this_local._7_1_ = 0;
            }
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,0);
            bVar1 = std::operator==(pvVar3,"VERSION");
            if (bVar1) {
              this_local._7_1_ =
                   HandleVersionMode(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)param_2_local);
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_250);
              poVar4 = std::operator<<((ostream *)local_250,"given unknown first argument \"");
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,0);
              poVar4 = std::operator<<(poVar4,(string *)pvVar3);
              std::operator<<(poVar4,"\"");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_270);
              std::__cxx11::string::~string((string *)&local_270);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream(local_250);
            }
          }
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakePolicyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("requires at least one argument.");
    return false;
    }

  if(args[0] == "SET")
    {
    return this->HandleSetMode(args);
    }
  else if(args[0] == "GET")
    {
    return this->HandleGetMode(args);
    }
  else if(args[0] == "PUSH")
    {
    if(args.size() > 1)
      {
      this->SetError("PUSH may not be given additional arguments.");
      return false;
      }
    this->Makefile->PushPolicy();
    return true;
    }
  else if(args[0] == "POP")
    {
    if(args.size() > 1)
      {
      this->SetError("POP may not be given additional arguments.");
      return false;
      }
    this->Makefile->PopPolicy();
    return true;
    }
  else if(args[0] == "VERSION")
    {
    return this->HandleVersionMode(args);
    }

  std::ostringstream e;
  e << "given unknown first argument \"" << args[0] << "\"";
  this->SetError(e.str());
  return false;
}